

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPrintVisitor.cpp
# Opt level: O0

void __thiscall CPrintVisitor::Visit(CPrintVisitor *this,CCompExp *exp)

{
  initializer_list<INode_*> __l;
  int id;
  mapped_type *pmVar1;
  allocator local_169;
  string local_168 [32];
  ChildrenAnswers local_148;
  string local_118 [32];
  string local_f8 [32];
  undefined1 local_d8 [8];
  string operationDescription;
  undefined1 local_b0 [4];
  int operationId;
  undefined1 local_98 [8];
  ChildrenAnswers answers;
  allocator<INode_*> local_51;
  pointer local_50;
  pointer local_48;
  pointer *local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<INode_*,_std::allocator<INode_*>_> children;
  CCompExp *exp_local;
  CPrintVisitor *this_local;
  
  children.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)exp;
  local_50 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::get(&exp->leftOperand)
  ;
  local_48 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::get
                       ((unique_ptr<IExpression,_std::default_delete<IExpression>_> *)
                        (children.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 4));
  local_40 = &local_50;
  local_38 = 2;
  std::allocator<INode_*>::allocator(&local_51);
  __l._M_len = local_38;
  __l._M_array = (iterator)local_40;
  std::vector<INode_*,_std::allocator<INode_*>_>::vector
            ((vector<INode_*,_std::allocator<INode_*>_> *)local_30,__l,&local_51);
  std::allocator<INode_*>::~allocator(&local_51);
  std::vector<INode_*,_std::allocator<INode_*>_>::vector
            ((vector<INode_*,_std::allocator<INode_*>_> *)local_b0,
             (vector<INode_*,_std::allocator<INode_*>_> *)local_30);
  VisitChildren((ChildrenAnswers *)local_98,this,
                (vector<INode_*,_std::allocator<INode_*>_> *)local_b0);
  std::vector<INode_*,_std::allocator<INode_*>_>::~vector
            ((vector<INode_*,_std::allocator<INode_*>_> *)local_b0);
  id = this->lastVisited + 1;
  this->lastVisited = id;
  pmVar1 = std::
           map<enums::TCompareOperation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<enums::TCompareOperation>,_std::allocator<std::pair<const_enums::TCompareOperation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&CCompExp::stringOperations_abi_cxx11_,
                        (key_type *)
                        (children.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 5));
  std::__cxx11::string::string(local_f8,(string *)pmVar1);
  ConstructLabel((CPrintVisitor *)local_d8,(string *)this,(int)local_f8);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::string(local_118,(string *)local_d8);
  ChildrenAnswers::PushBack((ChildrenAnswers *)local_98,(string *)local_118,id);
  std::__cxx11::string::~string(local_118);
  ChildrenAnswers::ChildrenAnswers(&local_148,(ChildrenAnswers *)local_98);
  AddChildrenAnswers(this,(ChildrenAnswers *)&local_148);
  ChildrenAnswers::~ChildrenAnswers(&local_148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"CompExp",&local_169);
  AddLabel(this,(string *)local_168);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  this->lastVisited = this->lastVisited + 1;
  std::__cxx11::string::~string((string *)local_d8);
  ChildrenAnswers::~ChildrenAnswers((ChildrenAnswers *)local_98);
  std::vector<INode_*,_std::allocator<INode_*>_>::~vector
            ((vector<INode_*,_std::allocator<INode_*>_> *)local_30);
  return;
}

Assistant:

void CPrintVisitor::Visit(CCompExp &exp) {
	std::vector<INode*> children = { exp.leftOperand.get(), exp.rightOperand.get() };
	ChildrenAnswers answers = VisitChildren(children);

	int operationId = ++lastVisited;
	std::string operationDescription = ConstructLabel(exp.stringOperations[exp.operation], operationId);
	answers.PushBack(operationDescription, operationId);

	AddChildrenAnswers(answers);
	AddLabel("CompExp");
	++lastVisited;
}